

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,char *filename,NameSet *rowNames,NameSet *colNames,DIdxSet *intVars)

{
  int iVar1;
  DIdxSet *in_RCX;
  NameSet *in_RDX;
  NameSet *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  bool success;
  undefined1 local_29;
  
  iVar1 = intParam(in_RDI,READMODE);
  if (iVar1 == 0) {
    local_29 = _readFileReal(unaff_retaddr,(char *)in_RDI,in_RSI,in_RDX,in_RCX);
  }
  else {
    local_29 = _readFileRational(unaff_retaddr,(char *)in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_29;
}

Assistant:

bool SoPlexBase<R>::readFile(const char* filename, NameSet* rowNames, NameSet* colNames,
                             DIdxSet* intVars)
{
   bool success = false;

   if(intParam(SoPlexBase<R>::READMODE) == READMODE_REAL)
      success = _readFileReal(filename, rowNames, colNames, intVars);
   else
      success = _readFileRational(filename, rowNames, colNames, intVars);

   return success;
}